

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_run_optimize(roaring_bitmap_t *r)

{
  undefined8 in_RAX;
  container_t *pcVar1;
  int i;
  ulong uVar2;
  _Bool _Var3;
  uint8_t type_after;
  undefined8 uStack_28;
  
  _Var3 = false;
  uStack_28 = in_RAX;
  for (uVar2 = 0; (long)uVar2 < (long)(r->high_low_container).size; uVar2 = uVar2 + 1) {
    ra_unshare_container_at_index(&r->high_low_container,(uint16_t)uVar2);
    pcVar1 = convert_run_optimize
                       ((r->high_low_container).containers[uVar2 & 0xffff],
                        (r->high_low_container).typecodes[uVar2 & 0xffff],
                        (uint8_t *)((long)&uStack_28 + 7));
    _Var3 = (_Bool)(_Var3 | uStack_28._7_1_ == '\x03');
    (r->high_low_container).containers[uVar2] = pcVar1;
    (r->high_low_container).typecodes[uVar2] = uStack_28._7_1_;
  }
  return _Var3;
}

Assistant:

bool roaring_bitmap_run_optimize(roaring_bitmap_t *r) {
    bool answer = false;
    for (int i = 0; i < r->high_low_container.size; i++) {
        uint8_t type_original, type_after;
        ra_unshare_container_at_index(
            &r->high_low_container,
            (uint16_t)i);  // TODO: this introduces extra cloning!
        container_t *c = ra_get_container_at_index(&r->high_low_container,
                                                   (uint16_t)i, &type_original);
        container_t *c1 = convert_run_optimize(c, type_original, &type_after);
        if (type_after == RUN_CONTAINER_TYPE) {
            answer = true;
        }
        ra_set_container_at_index(&r->high_low_container, i, c1, type_after);
    }
    return answer;
}